

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QDockAreaLayoutItem * __thiscall
QDockAreaLayoutInfo::item(QDockAreaLayoutInfo *this,QList<int> *path)

{
  int iVar1;
  ulong uVar2;
  QDockAreaLayoutInfo *this_00;
  Data *pDVar3;
  CutResult CVar4;
  pointer pQVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype p;
  QList<int> local_58;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (path->d).size;
  iVar1 = *(path->d).ptr;
  pQVar5 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  if (uVar2 < 2) {
    pQVar5 = pQVar5 + iVar1;
  }
  else {
    this_00 = pQVar5[iVar1].subinfo;
    local_38 = 1;
    local_40 = -1;
    CVar4 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_38,&local_40);
    if (CVar4 < Full) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (int *)0x0;
      local_58.d.size = 0;
      pQVar5 = item(this_00,&local_58);
    }
    else {
      if (CVar4 == Full) {
        local_58.d.d = (path->d).d;
        local_58.d.ptr = (path->d).ptr;
        local_58.d.size = (path->d).size;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
          super___atomic_base<int>._M_i =
               (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr =
             (int *)QArrayData::allocate((QArrayData **)&local_58,4,0x10,local_40,KeepSize);
        local_58.d.size = local_40;
        pDVar3 = local_58.d.d;
        if (local_40 != 0) {
          memcpy(local_58.d.ptr,(path->d).ptr + local_38,local_40 * 4);
        }
        local_58.d.d = pDVar3;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,4,0x10);
          }
        }
      }
      pDVar3 = local_58.d.d;
      pQVar5 = item(this_00,&local_58);
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutItem &QDockAreaLayoutInfo::item(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    if (path.size() > 1) {
        const QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->item(path.mid(1));
    }
    return item_list[index];
}